

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

bool __thiscall
libcellml::Analyser::addExternalVariable
          (Analyser *this,AnalyserExternalVariablePtr *externalVariable)

{
  bool bVar1;
  AnalyserImpl *pAVar2;
  __normal_iterator<std::shared_ptr<libcellml::AnalyserExternalVariable>_*,_std::vector<std::shared_ptr<libcellml::AnalyserExternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>_>_>_>
  local_40;
  shared_ptr<libcellml::AnalyserExternalVariable> *local_38;
  __normal_iterator<std::shared_ptr<libcellml::AnalyserExternalVariable>_*,_std::vector<std::shared_ptr<libcellml::AnalyserExternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>_>_>_>
  local_30;
  __normal_iterator<std::shared_ptr<libcellml::AnalyserExternalVariable>_*,_std::vector<std::shared_ptr<libcellml::AnalyserExternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>_>_>_>
  local_28;
  AnalyserExternalVariablePtr *local_20;
  AnalyserExternalVariablePtr *externalVariable_local;
  Analyser *this_local;
  
  local_20 = externalVariable;
  externalVariable_local = (AnalyserExternalVariablePtr *)this;
  pAVar2 = pFunc(this);
  local_30._M_current =
       (shared_ptr<libcellml::AnalyserExternalVariable> *)
       std::
       vector<std::shared_ptr<libcellml::AnalyserExternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>_>_>
       ::begin(&pAVar2->mExternalVariables);
  pAVar2 = pFunc(this);
  local_38 = (shared_ptr<libcellml::AnalyserExternalVariable> *)
             std::
             vector<std::shared_ptr<libcellml::AnalyserExternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>_>_>
             ::end(&pAVar2->mExternalVariables);
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::AnalyserExternalVariable>*,std::vector<std::shared_ptr<libcellml::AnalyserExternalVariable>,std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>>>>,std::shared_ptr<libcellml::AnalyserExternalVariable>>
                       (local_30,(__normal_iterator<std::shared_ptr<libcellml::AnalyserExternalVariable>_*,_std::vector<std::shared_ptr<libcellml::AnalyserExternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>_>_>_>
                                  )local_38,local_20);
  pAVar2 = pFunc(this);
  local_40._M_current =
       (shared_ptr<libcellml::AnalyserExternalVariable> *)
       std::
       vector<std::shared_ptr<libcellml::AnalyserExternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>_>_>
       ::end(&pAVar2->mExternalVariables);
  bVar1 = __gnu_cxx::operator==(&local_28,&local_40);
  if (bVar1) {
    pAVar2 = pFunc(this);
    std::
    vector<std::shared_ptr<libcellml::AnalyserExternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>_>_>
    ::push_back(&pAVar2->mExternalVariables,local_20);
  }
  return bVar1;
}

Assistant:

bool Analyser::addExternalVariable(const AnalyserExternalVariablePtr &externalVariable)
{
    if (std::find(pFunc()->mExternalVariables.begin(), pFunc()->mExternalVariables.end(), externalVariable) == pFunc()->mExternalVariables.end()) {
        pFunc()->mExternalVariables.push_back(externalVariable);

        return true;
    }

    return false;
}